

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O1

wchar_t scan_unicode_pattern
                  (char *out,wchar_t *wout,char *u16be,char *u16le,char *pattern,wchar_t mac_nfd)

{
  wchar_t wVar1;
  byte bVar2;
  wchar_t wVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  char *_p;
  uint *puVar10;
  long lVar11;
  
  uVar4 = 0;
  wVar1 = L'\0';
  puVar10 = (uint *)out;
  do {
    bVar7 = *pattern;
    wVar3 = (wchar_t)uVar4;
    if ((byte)(bVar7 - 0x30) < 10) {
      uVar4 = (ulong)(uint)((uint)(byte)(bVar7 - 0x30) | wVar3 << 4);
    }
    else if ((byte)(bVar7 + 0xbf) < 6) {
      uVar4 = (ulong)(uint)((wVar3 * 0x10 + (uint)bVar7) - 0x37);
    }
    else {
      if ((mac_nfd != L'\0') && (puVar10 == (uint *)out)) {
        if (wVar3 < L'⊄') {
          if ((((uint)(wVar3 + L'\xffffddbc') < 0x3e) &&
              ((0x30f73e0050000029U >> ((ulong)(uint)(wVar3 + L'\xffffddbc') & 0x3f) & 1) != 0)) ||
             ((((uint)(wVar3 + L'\xffffde6c') < 0x3c &&
               ((0xe000000040000c1U >> ((ulong)(uint)(wVar3 + L'\xffffde6c') & 0x3f) & 1) != 0)) ||
              (((uint)(wVar3 + L'\xffffddfc') < 0x3e &&
               ((0x2000000500000121U >> ((ulong)(uint)(wVar3 + L'\xffffddfc') & 0x3f) & 1) != 0)))))
             ) {
LAB_001341f8:
            wVar1 = L'\x01';
          }
        }
        else if (((((uint)(wVar3 + L'\xffffdd7c') < 0x2c) &&
                  ((0xf0000000033U >> ((ulong)(uint)(wVar3 + L'\xffffdd7c') & 0x3f) & 1) != 0)) ||
                 (((uint)(wVar3 + L'\xffffdd20') < 0xe &&
                  ((0x3c0fU >> (wVar3 + L'\xffffdd20' & 0x1fU) & 1) != 0)))) ||
                (((uint)(wVar3 + L'\xfffeef66') < 0x12 &&
                 ((0x20005U >> (wVar3 + L'\xfffeef66' & 0x1fU) & 1) != 0)))) goto LAB_001341f8;
      }
      bVar7 = (byte)(uVar4 >> 8);
      if ((uint)wVar3 < 0x10000) {
        *u16be = bVar7;
        lVar5 = 2;
        lVar6 = 1;
      }
      else {
        *u16be = (byte)((uint)(wVar3 + L'\x000f0000') >> 0x12) & 3 | 0xd8;
        ((byte *)u16be)[1] = (byte)((uint)(wVar3 + L'\x000f0000') >> 10);
        ((byte *)u16be)[2] = bVar7 & 3 | 0xdc;
        lVar5 = 4;
        lVar6 = 3;
      }
      bVar2 = (byte)uVar4;
      ((byte *)u16be)[lVar6] = bVar2;
      if ((uint)wVar3 < 0x10000) {
        *u16le = bVar2;
        lVar6 = 2;
        lVar11 = 1;
      }
      else {
        *u16le = (byte)((uint)(wVar3 + L'\x000f0000') >> 10);
        ((byte *)u16le)[1] = (byte)((uint)(wVar3 + L'\x000f0000') >> 0x12) & 3 | 0xd8;
        ((byte *)u16le)[2] = bVar2;
        bVar7 = bVar7 & 3 | 0xdc;
        lVar6 = 4;
        lVar11 = 3;
      }
      ((byte *)u16le)[lVar11] = bVar7;
      *wout = wVar3;
      iVar9 = (int)puVar10;
      if ((uint)wVar3 < 0x80) {
        iVar8 = iVar9 + 1;
        *(byte *)puVar10 = bVar2;
      }
      else if ((uint)wVar3 < 0x800) {
        *(byte *)puVar10 = (byte)(uVar4 >> 6) | 0xc0;
        iVar8 = iVar9 + 2;
        *(byte *)((long)puVar10 + 1) = bVar2 & 0x3f | 0x80;
      }
      else if ((uint)wVar3 < 0x10000) {
        *(byte *)puVar10 = (byte)(uVar4 >> 0xc) | 0xe0;
        *(byte *)((long)puVar10 + 1) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        iVar8 = iVar9 + 3;
        *(byte *)((long)puVar10 + 2) = bVar2 & 0x3f | 0x80;
      }
      else {
        iVar8 = iVar9 + 4;
        *puVar10 = (wVar3 << 0x18 |
                   (wVar3 & 0x3fc0U) << 10 |
                   (uint)(uVar4 >> 0x12) & 0xff | (uint)(uVar4 >> 4) & 0xff00) & 0x3f3f3f07U |
                   0x808080f0;
      }
      u16be = (char *)((byte *)u16be + lVar5);
      u16le = (char *)((byte *)u16le + lVar6);
      wout = wout + 1;
      puVar10 = (uint *)((long)puVar10 + (long)(iVar8 - iVar9));
      uVar4 = 0;
      if (*pattern == 0) {
        ((byte *)u16be)[0] = 0;
        ((byte *)u16be)[1] = 0;
        ((byte *)u16le)[0] = 0;
        ((byte *)u16le)[1] = 0;
        *wout = L'\0';
        *(byte *)puVar10 = 0;
        return wVar1;
      }
    }
    pattern = (char *)((byte *)pattern + 1);
  } while( true );
}

Assistant:

static int
scan_unicode_pattern(char *out, wchar_t *wout, char *u16be, char *u16le,
    const char *pattern, int mac_nfd)
{
	unsigned uc = 0;
	const char *p = pattern;
	char *op = out;
	wchar_t *owp = wout;
	char *op16be = u16be;
	char *op16le = u16le;
	int ret = 0;

	for (;;) {
		if (*p >= '0' && *p <= '9')
			uc = (uc << 4) + (*p - '0');
		else if (*p >= 'A' && *p <= 'F')
			uc = (uc << 4) + (*p - 'A' + 0x0a);
		else {
			if (mac_nfd && op == out) {
				/*
				 * These are not converted to NFD on Mac OS.
 				 * U+2000 - U+2FFF
				 * U+F900 - U+FAFF
				 * U+2F800 - U+2FAFF
				 */
				switch (uc) {
				case 0x2194: case 0x219A: case 0x219B:
				case 0x21AE: case 0x21CD: case 0x21CE:
				case 0x21CF: case 0x2204: case 0x2209:
				case 0x220C: case 0x2224: case 0x2226:
				case 0x2241: case 0x2244: case 0x2247:
				case 0x2249: case 0x2260: case 0x2262:
				case 0x226D: case 0x226E: case 0x226F:
				case 0x2270: case 0x2271: case 0x2274:
				case 0x2275: case 0x2276: case 0x2278:
				case 0x2279: case 0x227A: case 0x227B:
				case 0x2280: case 0x2281: case 0x2284:
				case 0x2285: case 0x2288: case 0x2289:
				case 0x22AC: case 0x22AD: case 0x22AE:
				case 0x22AF: case 0x22E0: case 0x22E1:
				case 0x22E2: case 0x22E3: case 0x22EA:
				case 0x22EB: case 0x22EC: case 0x22ED:
				
				/*
				 * Those code points are not converted to
				 * NFD on Mac OS. I do not know the reason
				 * because it is undocumented.
				 *   NFC        NFD
				 *   1109A  ==> 11099 110BA
				 *   1109C  ==> 1109B 110BA
				 *   110AB  ==> 110A5 110BA
				 */
				case 0x1109A: case 0x1109C: case 0x110AB:
					ret = 1;
					break;
				}
			}
			op16be += unicode_to_utf16be(op16be, uc);
			op16le += unicode_to_utf16le(op16le, uc);
			owp += unicode_to_wc(owp, uc);
			op += unicode_to_utf8(op, uc);
			if (!*p) {
				*op16be++ = 0;
				*op16be = 0;
				*op16le++ = 0;
				*op16le = 0;
				*owp = L'\0';
				*op = '\0';
				break;
			}
			uc = 0;
		}
		p++;
	}
	return (ret);
}